

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

bool __thiscall trun::Process_Unix::SetNonBlockingPipe(Process_Unix *this,int *filedes)

{
  int iVar1;
  ILogger *pIVar2;
  int *piVar3;
  string local_30;
  
  iVar1 = fcntl(*filedes,0x800);
  if (iVar1 == -1) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process_Unix","");
    pIVar2 = gnilk::Logger::GetLogger(&local_30);
    piVar3 = __errno_location();
    gnilk::Log::Error<char_const*,int>(pIVar2,"fcntl %d",*piVar3);
  }
  else {
    iVar1 = fcntl(filedes[1],0x800);
    if (iVar1 != -1) {
      return true;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"conapp","");
    pIVar2 = gnilk::Logger::GetLogger(&local_30);
    piVar3 = __errno_location();
    gnilk::Log::Error<char_const*,int>(pIVar2,"fcntl %d",*piVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool Process_Unix::SetNonBlockingPipe(int *filedes) {
	int status = fcntl(filedes[0], O_NONBLOCK);
	if (status == -1) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("fcntl %d", errno);
		return false;
	}
	status = fcntl(filedes[1], O_NONBLOCK);
	if (status == -1) {
        gnilk::Logger::GetLogger("conapp")->Error("fcntl %d", errno);
		return false;			
	}
	return true;
}